

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O2

void __thiscall xray_re::xr_ogf_v3::load_skeletonx_pm(xr_ogf_v3 *this,xr_reader *r)

{
  load_skeletonx(this,r);
  load_progressive_fixed_visual(this,r);
  return;
}

Assistant:

void xr_ogf_v3::load_skeletonx_pm(xr_reader& r)
{
	load_skeletonx(r);
	load_progressive_fixed_visual(r);
}